

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-donna-impl-base.h
# Opt level: O1

int ge25519_unpack_negative_vartime(ge25519 *r,uchar *p)

{
  byte bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  ulong uVar578;
  ulong uVar579;
  ulong uVar580;
  ulong uVar581;
  long lVar582;
  ulong uVar583;
  ulong uVar584;
  ulong uVar585;
  ulong uVar586;
  ulong uVar587;
  ulong uVar588;
  ulong uVar589;
  ulong uVar590;
  ulong uVar591;
  uint uVar592;
  ulong uVar593;
  long lVar594;
  uint64_t *puVar595;
  ulong uVar596;
  ulong uVar597;
  ulong uVar598;
  ulong uVar599;
  ulong uVar600;
  ulong uVar601;
  ulong uVar602;
  ulong uVar603;
  ulong uVar604;
  ulong uVar605;
  ulong uVar606;
  ulong uVar607;
  ulong uVar608;
  ulong uVar609;
  ulong uVar610;
  ulong uVar611;
  ulong uVar612;
  ulong uVar613;
  ulong uVar614;
  uchar check [32];
  bignum25519 t0;
  bignum25519 c;
  uint64_t local_b8;
  uint64_t auStack_b0 [4];
  undefined8 local_90;
  uint64_t local_88 [6];
  uint64_t local_58 [5];
  
  uVar585 = *(ulong *)p & 0x7ffffffffffff;
  uVar612 = *(ulong *)p >> 0x33 | (*(ulong *)(p + 8) & 0x3fffffffff) << 0xd;
  uVar578 = *(ulong *)(p + 8) >> 0x26 | (*(ulong *)(p + 0x10) & 0x1ffffff) << 0x1a;
  uVar607 = *(ulong *)(p + 0x10) >> 0x19 | (*(ulong *)(p + 0x18) & 0xfff) << 0x27;
  uVar603 = *(ulong *)(p + 0x18) >> 0xc & 0x7ffffffffffff;
  uVar579 = uVar585 * 2;
  uVar590 = uVar603 * 0x26;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar585;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = uVar585;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar612;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = uVar590;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar578 * 0x26;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = uVar607;
  auVar6 = auVar7 * auVar292 + auVar6 * auVar291 + auVar8 * auVar293;
  uVar583 = auVar6._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar579;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = uVar612;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar578;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = uVar590;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar607 * 0x13;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = uVar607;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar579;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = uVar578;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar612;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = uVar612;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar590;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = uVar607;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar579;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = uVar607;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar612 * 2;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = uVar578;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar603 * 0x13;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = uVar603;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar579;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = uVar603;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar612 * 2;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = uVar607;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar578;
  auVar305._8_8_ = 0;
  auVar305._0_8_ = uVar578;
  auVar529._8_8_ = 0;
  auVar529._0_8_ = auVar6._8_8_ << 0xd | uVar583 >> 0x33;
  auVar529 = auVar10 * auVar295 + auVar11 * auVar296 + auVar9 * auVar294 + auVar529;
  uVar593 = auVar529._0_8_;
  auVar530._8_8_ = 0;
  auVar530._0_8_ = auVar529._8_8_ * 0x2000 | uVar593 >> 0x33;
  auVar530 = auVar12 * auVar297 + auVar13 * auVar298 + auVar14 * auVar299 + auVar530;
  uVar608 = auVar530._0_8_;
  auVar531._8_8_ = 0;
  auVar531._0_8_ = auVar530._8_8_ * 0x2000 | uVar608 >> 0x33;
  auVar531 = auVar16 * auVar301 + auVar15 * auVar300 + auVar17 * auVar302 + auVar531;
  uVar590 = auVar531._0_8_;
  auVar526._8_8_ = 0;
  auVar526._0_8_ = auVar531._8_8_ * 0x2000 | uVar590 >> 0x33;
  auVar526 = auVar19 * auVar304 + auVar20 * auVar305 + auVar18 * auVar303 + auVar526;
  uVar579 = auVar526._0_8_;
  uVar583 = (auVar526._8_8_ << 0xd | uVar579 >> 0x33) * 0x13 + (uVar583 & 0x7ffffffffffff);
  uVar598 = uVar583 & 0x7ffffffffffff;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar598;
  uVar613 = (uVar583 >> 0x33) + (uVar593 & 0x7ffffffffffff);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar613;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar598;
  uVar608 = uVar608 & 0x7ffffffffffff;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar608;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar598;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar613;
  uVar590 = uVar590 & 0x7ffffffffffff;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar590;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar598;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar608;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar613;
  uVar579 = uVar579 & 0x7ffffffffffff;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar579;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar598;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar613;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar590;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar608;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar613;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar579;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar590;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar608;
  auVar6 = auVar36 * ZEXT816(0x6164115ad394ed) +
           auVar21 * ZEXT816(0x34dca135978a3) +
           auVar37 * ZEXT816(0x1f7afc62973807) +
           auVar39 * ZEXT816(0x8949b964e481e1) + auVar38 * ZEXT816(0x70310d2021430b);
  uVar593 = auVar6._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar608;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar579;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar590;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar590;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar579;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar579;
  auVar532._8_8_ = 0;
  auVar532._0_8_ = auVar6._8_8_ * 0x2000 | uVar593 >> 0x33;
  auVar532 = auVar22 * ZEXT816(0x34dca135978a3) +
             auVar23 * ZEXT816(0x1a8283b156ebd) +
             auVar41 * ZEXT816(0x70310d2021430b) +
             auVar40 * ZEXT816(0x6164115ad394ed) + auVar42 * ZEXT816(0x8949b964e481e1) + auVar532;
  uVar583 = auVar532._0_8_;
  auVar533._8_8_ = 0;
  auVar533._0_8_ = auVar532._8_8_ * 0x2000 | uVar583 >> 0x33;
  auVar533 = auVar26 * ZEXT816(0x1a8283b156ebd) +
             auVar25 * ZEXT816(0x5e7a26001c029) +
             auVar44 * ZEXT816(0x8949b964e481e1) +
             auVar24 * ZEXT816(0x34dca135978a3) + auVar43 * ZEXT816(0x6164115ad394ed) + auVar533;
  uVar580 = auVar533._0_8_;
  auVar534._8_8_ = 0;
  auVar534._0_8_ = auVar533._8_8_ * 0x2000 | uVar580 >> 0x33;
  auVar534 = auVar28 * ZEXT816(0x739c663a03cbb) +
             auVar45 * ZEXT816(0x6164115ad394ed) +
             auVar27 * ZEXT816(0x34dca135978a3) + auVar29 * ZEXT816(0x1a8283b156ebd) +
             auVar30 * ZEXT816(0x5e7a26001c029) + auVar534;
  uVar599 = auVar534._0_8_;
  auVar535._8_8_ = 0;
  auVar535._0_8_ = auVar534._8_8_ * 0x2000 | uVar599 >> 0x33;
  auVar535 = auVar31 * ZEXT816(0x34dca135978a3) +
             auVar34 * ZEXT816(0x1a8283b156ebd) + auVar35 * ZEXT816(0x5e7a26001c029) +
             auVar32 * ZEXT816(0x52036cee2b6ff) + auVar33 * ZEXT816(0x739c663a03cbb) + auVar535;
  uVar600 = auVar535._0_8_;
  uVar596 = (auVar535._8_8_ * 0x2000 | uVar600 >> 0x33) * 0x13 + (uVar593 & 0x7ffffffffffff);
  uVar604 = (uVar596 >> 0x33) + (uVar583 & 0x7ffffffffffff);
  uVar586 = uVar613 + 0x1ffffffffffffc + (uVar598 + 0x1fffffffffffb3 >> 0x33);
  uVar587 = uVar608 + 0x1ffffffffffffc + (uVar586 >> 0x33);
  uVar591 = uVar590 + 0x1ffffffffffffc + (uVar587 >> 0x33);
  uVar588 = uVar579 + 0x1ffffffffffffc + (uVar591 >> 0x33);
  uVar589 = (uVar588 >> 0x33) * 0x13 + (uVar598 + 0x1fffffffffffb3 & 0x7ffffffffffff);
  uVar596 = uVar596 & 0x7ffffffffffff;
  uVar586 = uVar586 & 0x7ffffffffffff;
  uVar587 = uVar587 & 0x7ffffffffffff;
  uVar591 = uVar591 & 0x7ffffffffffff;
  uVar588 = uVar588 & 0x7ffffffffffff;
  uVar579 = uVar596 * 2 + 2;
  uVar596 = uVar596 + 1;
  uVar580 = uVar580 & 0x7ffffffffffff;
  uVar600 = uVar600 & 0x7ffffffffffff;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar596;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = uVar596;
  uVar590 = uVar600 * 0x26;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar604;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = uVar590;
  uVar599 = uVar599 & 0x7ffffffffffff;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar599;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = uVar580 * 0x26;
  auVar6 = auVar46 * auVar306 + auVar48 * auVar308 + auVar47 * auVar307;
  uVar583 = auVar6._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar579;
  auVar309._8_8_ = 0;
  auVar309._0_8_ = uVar604;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar580;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = uVar590;
  uVar613 = uVar599 * 0x13;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar599;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = uVar613;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar580;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = uVar579;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar604;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = uVar604;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar599;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = uVar590;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar599;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = uVar579;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar580;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = uVar604 * 2;
  uVar602 = uVar600 * 0x13;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar600;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = uVar602;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar600;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = uVar579;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar599;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = uVar604 * 2;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar580;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = uVar580;
  auVar536._8_8_ = 0;
  auVar536._0_8_ = auVar6._8_8_ << 0xd | uVar583 >> 0x33;
  auVar536 = auVar49 * auVar309 + auVar50 * auVar310 + auVar51 * auVar311 + auVar536;
  uVar579 = auVar536._0_8_;
  auVar537._8_8_ = 0;
  auVar537._0_8_ = auVar536._8_8_ * 0x2000 | uVar579 >> 0x33;
  auVar537 = auVar52 * auVar312 + auVar53 * auVar313 + auVar54 * auVar314 + auVar537;
  uVar590 = auVar537._0_8_;
  auVar538._8_8_ = 0;
  auVar538._0_8_ = auVar537._8_8_ * 0x2000 | uVar590 >> 0x33;
  auVar538 = auVar55 * auVar315 + auVar57 * auVar317 + auVar56 * auVar316 + auVar538;
  uVar598 = auVar538._0_8_;
  auVar539._8_8_ = 0;
  auVar539._0_8_ = auVar538._8_8_ * 0x2000 | uVar598 >> 0x33;
  auVar539 = auVar60 * auVar320 + auVar59 * auVar319 + auVar58 * auVar318 + auVar539;
  uVar608 = auVar539._0_8_;
  uVar583 = (auVar539._8_8_ * 0x2000 | uVar608 >> 0x33) * 0x13 + (uVar583 & 0x7ffffffffffff);
  uVar579 = (uVar583 >> 0x33) + (uVar579 & 0x7ffffffffffff);
  uVar583 = uVar583 & 0x7ffffffffffff;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar583;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = uVar596;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar579;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = uVar596;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar583;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = uVar604;
  uVar590 = uVar590 & 0x7ffffffffffff;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar590;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = uVar596;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar580;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = uVar583;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar579;
  auVar326._8_8_ = 0;
  auVar326._0_8_ = uVar604;
  uVar598 = uVar598 & 0x7ffffffffffff;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar598;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = uVar596;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar599;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = uVar583;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar590;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = uVar604;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar580;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = uVar579;
  uVar608 = uVar608 & 0x7ffffffffffff;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar608;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = uVar596;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar600;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = uVar583;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar599;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = uVar579;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar598;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = uVar604;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar590;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = uVar580;
  uVar601 = uVar604 * 0x13;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar579;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = uVar602;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar608;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = uVar601;
  uVar593 = uVar580 * 0x13;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar598;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = uVar593;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar590;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = uVar613;
  auVar6 = auVar76 * auVar336 +
           auVar61 * auVar321 + auVar77 * auVar337 + auVar79 * auVar339 + auVar78 * auVar338;
  uVar583 = auVar6._0_8_;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar590;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = uVar602;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar608;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = uVar593;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar598;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = uVar613;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar598;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = uVar602;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar608;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = uVar613;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar608;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = uVar602;
  auVar540._8_8_ = 0;
  auVar540._0_8_ = auVar6._8_8_ * 0x2000 | uVar583 >> 0x33;
  auVar540 = auVar62 * auVar322 +
             auVar63 * auVar323 + auVar81 * auVar341 + auVar80 * auVar340 + auVar82 * auVar342 +
             auVar540;
  uVar579 = auVar540._0_8_;
  auVar541._8_8_ = 0;
  auVar541._0_8_ = auVar540._8_8_ * 0x2000 | uVar579 >> 0x33;
  auVar541 = auVar65 * auVar325 + auVar84 * auVar344 + auVar64 * auVar324 + auVar83 * auVar343 +
             auVar66 * auVar326 + auVar541;
  uVar597 = auVar541._0_8_;
  auVar542._8_8_ = 0;
  auVar542._0_8_ = auVar541._8_8_ * 0x2000 | uVar597 >> 0x33;
  auVar542 = auVar70 * auVar330 +
             auVar68 * auVar328 + auVar85 * auVar345 + auVar67 * auVar327 + auVar69 * auVar329 +
             auVar542;
  uVar609 = auVar542._0_8_;
  auVar543._8_8_ = 0;
  auVar543._0_8_ = auVar542._8_8_ * 0x2000 | uVar609 >> 0x33;
  auVar543 = auVar73 * auVar333 +
             auVar72 * auVar332 + auVar71 * auVar331 + auVar74 * auVar334 + auVar75 * auVar335 +
             auVar543;
  uVar581 = auVar543._0_8_;
  uVar584 = (auVar543._8_8_ * 0x2000 | uVar581 >> 0x33) * 0x13 + (uVar583 & 0x7ffffffffffff);
  uVar614 = (uVar584 >> 0x33) + (uVar579 & 0x7ffffffffffff);
  uVar584 = uVar584 & 0x7ffffffffffff;
  uVar597 = uVar597 & 0x7ffffffffffff;
  uVar581 = uVar581 & 0x7ffffffffffff;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar584;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = uVar584;
  uVar590 = uVar581 * 0x26;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar614;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = uVar590;
  uVar609 = uVar609 & 0x7ffffffffffff;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar609;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = uVar597 * 0x26;
  auVar6 = auVar87 * auVar347 + auVar88 * auVar348 + auVar86 * auVar346;
  uVar583 = auVar6._0_8_;
  uVar579 = uVar584 * 2;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar579;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = uVar614;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar597;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = uVar590;
  uVar610 = uVar609 * 0x13;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar609;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = uVar610;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar597;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = uVar579;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar614;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = uVar614;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar609;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = uVar590;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar609;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = uVar579;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar597;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = uVar614 * 2;
  uVar606 = uVar581 * 0x13;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar581;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = uVar606;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar581;
  auVar358._8_8_ = 0;
  auVar358._0_8_ = uVar579;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar609;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = uVar614 * 2;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar597;
  auVar360._8_8_ = 0;
  auVar360._0_8_ = uVar597;
  auVar544._8_8_ = 0;
  auVar544._0_8_ = auVar6._8_8_ << 0xd | uVar583 >> 0x33;
  auVar544 = auVar89 * auVar349 + auVar91 * auVar351 + auVar90 * auVar350 + auVar544;
  uVar579 = auVar544._0_8_;
  auVar545._8_8_ = 0;
  auVar545._0_8_ = auVar544._8_8_ * 0x2000 | uVar579 >> 0x33;
  auVar545 = auVar93 * auVar353 + auVar94 * auVar354 + auVar92 * auVar352 + auVar545;
  uVar598 = auVar545._0_8_;
  auVar546._8_8_ = 0;
  auVar546._0_8_ = auVar545._8_8_ * 0x2000 | uVar598 >> 0x33;
  auVar546 = auVar96 * auVar356 + auVar95 * auVar355 + auVar97 * auVar357 + auVar546;
  uVar608 = auVar546._0_8_;
  auVar547._8_8_ = 0;
  auVar547._0_8_ = auVar546._8_8_ * 0x2000 | uVar608 >> 0x33;
  auVar547 = auVar99 * auVar359 + auVar98 * auVar358 + auVar100 * auVar360 + auVar547;
  uVar590 = auVar547._0_8_;
  uVar583 = (auVar547._8_8_ * 0x2000 | uVar590 >> 0x33) * 0x13 + (uVar583 & 0x7ffffffffffff);
  uVar579 = (uVar583 >> 0x33) + (uVar579 & 0x7ffffffffffff);
  uVar583 = uVar583 & 0x7ffffffffffff;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar583;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = uVar596;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar579;
  auVar362._8_8_ = 0;
  auVar362._0_8_ = uVar596;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar583;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = uVar604;
  uVar598 = uVar598 & 0x7ffffffffffff;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar598;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = uVar596;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar580;
  auVar365._8_8_ = 0;
  auVar365._0_8_ = uVar583;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar579;
  auVar366._8_8_ = 0;
  auVar366._0_8_ = uVar604;
  uVar608 = uVar608 & 0x7ffffffffffff;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar608;
  auVar367._8_8_ = 0;
  auVar367._0_8_ = uVar596;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar599;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = uVar583;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar598;
  auVar369._8_8_ = 0;
  auVar369._0_8_ = uVar604;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar580;
  auVar370._8_8_ = 0;
  auVar370._0_8_ = uVar579;
  uVar590 = uVar590 & 0x7ffffffffffff;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar590;
  auVar371._8_8_ = 0;
  auVar371._0_8_ = uVar596;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar600;
  auVar372._8_8_ = 0;
  auVar372._0_8_ = uVar583;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar599;
  auVar373._8_8_ = 0;
  auVar373._0_8_ = uVar579;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar608;
  auVar374._8_8_ = 0;
  auVar374._0_8_ = uVar604;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = uVar598;
  auVar375._8_8_ = 0;
  auVar375._0_8_ = uVar580;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = uVar579;
  auVar376._8_8_ = 0;
  auVar376._0_8_ = uVar602;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = uVar590;
  auVar377._8_8_ = 0;
  auVar377._0_8_ = uVar601;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = uVar608;
  auVar378._8_8_ = 0;
  auVar378._0_8_ = uVar593;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar598;
  auVar379._8_8_ = 0;
  auVar379._0_8_ = uVar613;
  auVar6 = auVar117 * auVar377 + auVar119 * auVar379 + auVar118 * auVar378 + auVar101 * auVar361 +
           auVar116 * auVar376;
  uVar579 = auVar6._0_8_;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar598;
  auVar380._8_8_ = 0;
  auVar380._0_8_ = uVar602;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = uVar590;
  auVar381._8_8_ = 0;
  auVar381._0_8_ = uVar593;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uVar608;
  auVar382._8_8_ = 0;
  auVar382._0_8_ = uVar613;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar608;
  auVar383._8_8_ = 0;
  auVar383._0_8_ = uVar602;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar590;
  auVar384._8_8_ = 0;
  auVar384._0_8_ = uVar613;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar590;
  auVar385._8_8_ = 0;
  auVar385._0_8_ = uVar602;
  auVar548._8_8_ = 0;
  auVar548._0_8_ = auVar6._8_8_ * 0x2000 | uVar579 >> 0x33;
  auVar548 = auVar102 * auVar362 +
             auVar103 * auVar363 + auVar122 * auVar382 + auVar120 * auVar380 + auVar121 * auVar381 +
             auVar548;
  uVar598 = auVar548._0_8_;
  auVar549._8_8_ = 0;
  auVar549._0_8_ = auVar548._8_8_ * 0x2000 | uVar598 >> 0x33;
  auVar549 = auVar106 * auVar366 +
             auVar105 * auVar365 + auVar124 * auVar384 + auVar123 * auVar383 + auVar104 * auVar364 +
             auVar549;
  uVar605 = auVar549._0_8_;
  auVar550._8_8_ = 0;
  auVar550._0_8_ = auVar549._8_8_ * 0x2000 | uVar605 >> 0x33;
  auVar550 = auVar110 * auVar370 +
             auVar125 * auVar385 + auVar107 * auVar367 + auVar109 * auVar369 + auVar108 * auVar368 +
             auVar550;
  uVar590 = auVar550._0_8_;
  auVar551._8_8_ = 0;
  auVar551._0_8_ = auVar550._8_8_ * 0x2000 | uVar590 >> 0x33;
  auVar551 = auVar113 * auVar373 +
             auVar112 * auVar372 + auVar111 * auVar371 + auVar114 * auVar374 + auVar115 * auVar375 +
             auVar551;
  uVar583 = auVar551._0_8_;
  uVar579 = (auVar551._8_8_ * 0x2000 | uVar583 >> 0x33) * 0x13 + (uVar579 & 0x7ffffffffffff);
  uVar608 = (uVar579 >> 0x33) + (uVar598 & 0x7ffffffffffff);
  uVar579 = uVar579 & 0x7ffffffffffff;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar579;
  auVar386._8_8_ = 0;
  auVar386._0_8_ = uVar589;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar608;
  auVar387._8_8_ = 0;
  auVar387._0_8_ = uVar589;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uVar579;
  auVar388._8_8_ = 0;
  auVar388._0_8_ = uVar586;
  uVar605 = uVar605 & 0x7ffffffffffff;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar605;
  auVar389._8_8_ = 0;
  auVar389._0_8_ = uVar589;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar579;
  auVar390._8_8_ = 0;
  auVar390._0_8_ = uVar587;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = uVar608;
  auVar391._8_8_ = 0;
  auVar391._0_8_ = uVar586;
  uVar590 = uVar590 & 0x7ffffffffffff;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar590;
  auVar392._8_8_ = 0;
  auVar392._0_8_ = uVar589;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar579;
  auVar393._8_8_ = 0;
  auVar393._0_8_ = uVar591;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uVar605;
  auVar394._8_8_ = 0;
  auVar394._0_8_ = uVar586;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar608;
  auVar395._8_8_ = 0;
  auVar395._0_8_ = uVar587;
  uVar583 = uVar583 & 0x7ffffffffffff;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar583;
  auVar396._8_8_ = 0;
  auVar396._0_8_ = uVar589;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar579;
  auVar397._8_8_ = 0;
  auVar397._0_8_ = uVar588;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar608;
  auVar398._8_8_ = 0;
  auVar398._0_8_ = uVar591;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uVar590;
  auVar399._8_8_ = 0;
  auVar399._0_8_ = uVar586;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = uVar605;
  auVar400._8_8_ = 0;
  auVar400._0_8_ = uVar587;
  uVar598 = uVar587 * 0x13;
  uVar611 = uVar588 * 0x13;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar608;
  auVar401._8_8_ = 0;
  auVar401._0_8_ = uVar611;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar583;
  auVar402._8_8_ = 0;
  auVar402._0_8_ = uVar586 * 0x13;
  local_90 = SUB168(auVar142 * auVar402,0);
  uVar608 = uVar591 * 0x13;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar590;
  auVar403._8_8_ = 0;
  auVar403._0_8_ = uVar598;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar605;
  auVar404._8_8_ = 0;
  auVar404._0_8_ = uVar608;
  auVar6 = auVar142 * auVar402 + auVar144 * auVar404 + auVar143 * auVar403 + auVar126 * auVar386 +
           auVar141 * auVar401;
  uVar579 = auVar6._0_8_;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar605;
  auVar405._8_8_ = 0;
  auVar405._0_8_ = uVar611;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uVar583;
  auVar406._8_8_ = 0;
  auVar406._0_8_ = uVar598;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar590;
  auVar407._8_8_ = 0;
  auVar407._0_8_ = uVar608;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar590;
  auVar408._8_8_ = 0;
  auVar408._0_8_ = uVar611;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar583;
  auVar409._8_8_ = 0;
  auVar409._0_8_ = uVar608;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar583;
  auVar410._8_8_ = 0;
  auVar410._0_8_ = uVar611;
  auVar552._8_8_ = 0;
  auVar552._0_8_ = auVar6._8_8_ * 0x2000 | uVar579 >> 0x33;
  auVar552 = auVar127 * auVar387 +
             auVar128 * auVar388 + auVar147 * auVar407 + auVar145 * auVar405 + auVar146 * auVar406 +
             auVar552;
  uVar605 = auVar552._0_8_;
  auVar553._8_8_ = 0;
  auVar553._0_8_ = auVar552._8_8_ * 0x2000 | uVar605 >> 0x33;
  auVar553 = auVar131 * auVar391 +
             auVar130 * auVar390 + auVar129 * auVar389 + auVar148 * auVar408 + auVar149 * auVar409 +
             auVar553;
  uVar590 = auVar553._0_8_;
  auVar554._8_8_ = 0;
  auVar554._0_8_ = auVar553._8_8_ * 0x2000 | uVar590 >> 0x33;
  auVar554 = auVar135 * auVar395 +
             auVar133 * auVar393 + auVar150 * auVar410 + auVar132 * auVar392 + auVar134 * auVar394 +
             auVar554;
  uVar583 = auVar554._0_8_;
  auVar555._8_8_ = 0;
  auVar555._0_8_ = auVar554._8_8_ * 0x2000 | uVar583 >> 0x33;
  bVar1 = p[0x1f];
  r->y[0] = uVar585;
  r->y[1] = uVar612;
  r->y[2] = uVar578;
  r->y[3] = uVar607;
  auVar555 = auVar138 * auVar398 +
             auVar137 * auVar397 + auVar136 * auVar396 + auVar140 * auVar400 + auVar139 * auVar399 +
             auVar555;
  uVar578 = auVar555._0_8_;
  r->y[4] = uVar603;
  uVar579 = (auVar555._8_8_ * 0x2000 | uVar578 >> 0x33) * 0x13 + (uVar579 & 0x7ffffffffffff);
  r->z[0] = 1;
  r->z[1] = 0;
  r->z[2] = 0;
  r->z[3] = 0;
  r->z[4] = 0;
  r->x[0] = uVar579 & 0x7ffffffffffff;
  r->x[1] = (uVar579 >> 0x33) + (uVar605 & 0x7ffffffffffff);
  r->x[2] = uVar590 & 0x7ffffffffffff;
  r->x[3] = uVar583 & 0x7ffffffffffff;
  r->x[4] = uVar578 & 0x7ffffffffffff;
  curve25519_square_times(local_58,r->x,1);
  curve25519_square_times(local_88,local_58,2);
  curve25519_mul_noinline(&local_b8,local_88,r->x);
  curve25519_mul_noinline(local_58,&local_b8,local_58);
  curve25519_square_times(local_88,local_58,1);
  curve25519_mul_noinline(&local_b8,local_88,&local_b8);
  curve25519_pow_two5mtwo0_two250mtwo0(&local_b8);
  curve25519_square_times(&local_b8,&local_b8,2);
  curve25519_mul_noinline(r->x,&local_b8,r->x);
  uVar579 = r->x[0];
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar584;
  auVar411._8_8_ = 0;
  auVar411._0_8_ = uVar579;
  uVar578 = r->x[1];
  auVar152._8_8_ = 0;
  auVar152._0_8_ = uVar584;
  auVar412._8_8_ = 0;
  auVar412._0_8_ = uVar578;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar614;
  auVar413._8_8_ = 0;
  auVar413._0_8_ = uVar579;
  uVar583 = r->x[2];
  auVar154._8_8_ = 0;
  auVar154._0_8_ = uVar584;
  auVar414._8_8_ = 0;
  auVar414._0_8_ = uVar583;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uVar597;
  auVar415._8_8_ = 0;
  auVar415._0_8_ = uVar579;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar614;
  auVar416._8_8_ = 0;
  auVar416._0_8_ = uVar578;
  uVar585 = r->x[3];
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uVar584;
  auVar417._8_8_ = 0;
  auVar417._0_8_ = uVar585;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uVar609;
  auVar418._8_8_ = 0;
  auVar418._0_8_ = uVar579;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar614;
  auVar419._8_8_ = 0;
  auVar419._0_8_ = uVar583;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar597;
  auVar420._8_8_ = 0;
  auVar420._0_8_ = uVar578;
  uVar590 = r->x[4];
  auVar161._8_8_ = 0;
  auVar161._0_8_ = uVar584;
  auVar421._8_8_ = 0;
  auVar421._0_8_ = uVar590;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uVar581;
  auVar422._8_8_ = 0;
  auVar422._0_8_ = uVar579;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = uVar609;
  auVar423._8_8_ = 0;
  auVar423._0_8_ = uVar578;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = uVar614;
  auVar424._8_8_ = 0;
  auVar424._0_8_ = uVar585;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = uVar597;
  auVar425._8_8_ = 0;
  auVar425._0_8_ = uVar583;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uVar606;
  auVar426._8_8_ = 0;
  auVar426._0_8_ = uVar578;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = uVar614 * 0x13;
  auVar427._8_8_ = 0;
  auVar427._0_8_ = uVar590;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uVar597 * 0x13;
  auVar428._8_8_ = 0;
  auVar428._0_8_ = uVar585;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = uVar610;
  auVar429._8_8_ = 0;
  auVar429._0_8_ = uVar583;
  auVar6 = auVar151 * auVar411 + auVar166 * auVar426 + auVar169 * auVar429 + auVar168 * auVar428 +
           auVar167 * auVar427;
  uVar578 = auVar6._0_8_;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = uVar606;
  auVar430._8_8_ = 0;
  auVar430._0_8_ = uVar583;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = uVar597 * 0x13;
  auVar431._8_8_ = 0;
  auVar431._0_8_ = uVar590;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = uVar610;
  auVar432._8_8_ = 0;
  auVar432._0_8_ = uVar585;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = uVar606;
  auVar433._8_8_ = 0;
  auVar433._0_8_ = uVar585;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uVar610;
  auVar434._8_8_ = 0;
  auVar434._0_8_ = uVar590;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = uVar606;
  auVar435._8_8_ = 0;
  auVar435._0_8_ = uVar590;
  auVar556._8_8_ = 0;
  auVar556._0_8_ = auVar6._8_8_ * 0x2000 | uVar578 >> 0x33;
  auVar556 = auVar153 * auVar413 +
             auVar152 * auVar412 + auVar170 * auVar430 + auVar171 * auVar431 + auVar172 * auVar432 +
             auVar556;
  uVar579 = auVar556._0_8_;
  auVar557._8_8_ = 0;
  auVar557._0_8_ = auVar556._8_8_ * 0x2000 | uVar579 >> 0x33;
  auVar557 = auVar156 * auVar416 +
             auVar155 * auVar415 + auVar174 * auVar434 + auVar173 * auVar433 + auVar154 * auVar414 +
             auVar557;
  uVar590 = auVar557._0_8_;
  auVar558._8_8_ = 0;
  auVar558._0_8_ = auVar557._8_8_ * 0x2000 | uVar590 >> 0x33;
  auVar558 = auVar159 * auVar419 +
             auVar157 * auVar417 + auVar175 * auVar435 + auVar158 * auVar418 + auVar160 * auVar420 +
             auVar558;
  uVar583 = auVar558._0_8_;
  auVar559._8_8_ = 0;
  auVar559._0_8_ = auVar558._8_8_ * 0x2000 | uVar583 >> 0x33;
  auVar559 = auVar162 * auVar422 + auVar163 * auVar423 + auVar165 * auVar425 + auVar161 * auVar421 +
             auVar164 * auVar424 + auVar559;
  uVar585 = auVar559._0_8_;
  uVar578 = (auVar559._8_8_ * 0x2000 | uVar585 >> 0x33) * 0x13 + (uVar578 & 0x7ffffffffffff);
  uVar579 = (uVar578 >> 0x33) + (uVar579 & 0x7ffffffffffff);
  uVar578 = uVar578 & 0x7ffffffffffff;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = uVar578;
  auVar436._8_8_ = 0;
  auVar436._0_8_ = uVar589;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = uVar579;
  auVar437._8_8_ = 0;
  auVar437._0_8_ = uVar589;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = uVar578;
  auVar438._8_8_ = 0;
  auVar438._0_8_ = uVar586;
  uVar590 = uVar590 & 0x7ffffffffffff;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = uVar590;
  auVar439._8_8_ = 0;
  auVar439._0_8_ = uVar589;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = uVar578;
  auVar440._8_8_ = 0;
  auVar440._0_8_ = uVar587;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = uVar579;
  auVar441._8_8_ = 0;
  auVar441._0_8_ = uVar586;
  uVar583 = uVar583 & 0x7ffffffffffff;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = uVar583;
  auVar442._8_8_ = 0;
  auVar442._0_8_ = uVar589;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = uVar578;
  auVar443._8_8_ = 0;
  auVar443._0_8_ = uVar591;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uVar590;
  auVar444._8_8_ = 0;
  auVar444._0_8_ = uVar586;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = uVar579;
  auVar445._8_8_ = 0;
  auVar445._0_8_ = uVar587;
  uVar585 = uVar585 & 0x7ffffffffffff;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uVar585;
  auVar446._8_8_ = 0;
  auVar446._0_8_ = uVar589;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = uVar578;
  auVar447._8_8_ = 0;
  auVar447._0_8_ = uVar588;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = uVar579;
  auVar448._8_8_ = 0;
  auVar448._0_8_ = uVar591;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = uVar583;
  auVar449._8_8_ = 0;
  auVar449._0_8_ = uVar586;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = uVar590;
  auVar450._8_8_ = 0;
  auVar450._0_8_ = uVar587;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = uVar579;
  auVar451._8_8_ = 0;
  auVar451._0_8_ = uVar611;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = uVar585;
  auVar452._8_8_ = 0;
  auVar452._0_8_ = uVar586 * 0x13;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar583;
  auVar453._8_8_ = 0;
  auVar453._0_8_ = uVar598;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = uVar590;
  auVar454._8_8_ = 0;
  auVar454._0_8_ = uVar608;
  auVar6 = auVar191 * auVar451 +
           auVar176 * auVar436 + auVar192 * auVar452 + auVar194 * auVar454 + auVar193 * auVar453;
  uVar610 = auVar6._0_8_;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uVar590;
  auVar455._8_8_ = 0;
  auVar455._0_8_ = uVar611;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar585;
  auVar456._8_8_ = 0;
  auVar456._0_8_ = uVar598;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uVar583;
  auVar457._8_8_ = 0;
  auVar457._0_8_ = uVar608;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = uVar583;
  auVar458._8_8_ = 0;
  auVar458._0_8_ = uVar611;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar585;
  auVar459._8_8_ = 0;
  auVar459._0_8_ = uVar608;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = uVar585;
  auVar460._8_8_ = 0;
  auVar460._0_8_ = uVar611;
  auVar560._8_8_ = 0;
  auVar560._0_8_ = auVar6._8_8_ * 0x2000 | uVar610 >> 0x33;
  auVar560 = auVar178 * auVar438 + auVar196 * auVar456 + auVar197 * auVar457 + auVar195 * auVar455 +
             auVar177 * auVar437 + auVar560;
  uVar579 = auVar560._0_8_;
  auVar561._8_8_ = 0;
  auVar561._0_8_ = auVar560._8_8_ * 0x2000 | uVar579 >> 0x33;
  auVar561 = auVar199 * auVar459 + auVar179 * auVar439 + auVar198 * auVar458 + auVar180 * auVar440 +
             auVar181 * auVar441 + auVar561;
  uVar606 = auVar561._0_8_;
  auVar562._8_8_ = 0;
  auVar562._0_8_ = auVar561._8_8_ * 0x2000 | uVar606 >> 0x33;
  auVar562 = auVar185 * auVar445 +
             auVar200 * auVar460 + auVar182 * auVar442 + auVar184 * auVar444 + auVar183 * auVar443 +
             auVar562;
  uVar583 = auVar562._0_8_;
  auVar563._8_8_ = 0;
  auVar563._0_8_ = auVar562._8_8_ * 0x2000 | uVar583 >> 0x33;
  auVar563 = auVar188 * auVar448 +
             auVar187 * auVar447 + auVar186 * auVar446 + auVar189 * auVar449 + auVar190 * auVar450 +
             auVar563;
  uVar578 = auVar563._0_8_;
  uVar585 = (auVar563._8_8_ * 0x2000 | uVar578 >> 0x33) * 0x13 + (uVar610 & 0x7ffffffffffff);
  uVar611 = (uVar585 >> 0x33) + (uVar579 & 0x7ffffffffffff);
  uVar585 = uVar585 & 0x7ffffffffffff;
  uVar606 = uVar606 & 0x7ffffffffffff;
  uVar583 = uVar583 & 0x7ffffffffffff;
  uVar578 = uVar578 & 0x7ffffffffffff;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = uVar585;
  auVar461._8_8_ = 0;
  auVar461._0_8_ = uVar585;
  uVar590 = uVar578 * 0x26;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = uVar611;
  auVar462._8_8_ = 0;
  auVar462._0_8_ = uVar590;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar583;
  auVar463._8_8_ = 0;
  auVar463._0_8_ = uVar606 * 0x26;
  lVar594 = 0;
  auVar6 = auVar202 * auVar462 + auVar203 * auVar463 + auVar201 * auVar461;
  uVar598 = auVar6._0_8_;
  uVar579 = uVar585 * 2;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = uVar579;
  auVar464._8_8_ = 0;
  auVar464._0_8_ = uVar611;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar606;
  auVar465._8_8_ = 0;
  auVar465._0_8_ = uVar590;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar583;
  auVar466._8_8_ = 0;
  auVar466._0_8_ = uVar583 * 0x13;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar606;
  auVar467._8_8_ = 0;
  auVar467._0_8_ = uVar579;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar611;
  auVar468._8_8_ = 0;
  auVar468._0_8_ = uVar611;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = uVar583;
  auVar469._8_8_ = 0;
  auVar469._0_8_ = uVar590;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = uVar583;
  auVar470._8_8_ = 0;
  auVar470._0_8_ = uVar579;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = uVar606;
  auVar471._8_8_ = 0;
  auVar471._0_8_ = uVar611 * 2;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = uVar578;
  auVar472._8_8_ = 0;
  auVar472._0_8_ = uVar578 * 0x13;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar578;
  auVar473._8_8_ = 0;
  auVar473._0_8_ = uVar579;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar583;
  auVar474._8_8_ = 0;
  auVar474._0_8_ = uVar611 * 2;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = uVar606;
  auVar475._8_8_ = 0;
  auVar475._0_8_ = uVar606;
  auVar564._8_8_ = 0;
  auVar564._0_8_ = auVar6._8_8_ << 0xd | uVar598 >> 0x33;
  auVar564 = auVar205 * auVar465 + auVar206 * auVar466 + auVar204 * auVar464 + auVar564;
  uVar590 = auVar564._0_8_;
  auVar565._8_8_ = 0;
  auVar565._0_8_ = auVar564._8_8_ * 0x2000 | uVar590 >> 0x33;
  auVar565 = auVar209 * auVar469 + auVar208 * auVar468 + auVar207 * auVar467 + auVar565;
  uVar579 = auVar565._0_8_;
  auVar566._8_8_ = 0;
  auVar566._0_8_ = auVar565._8_8_ * 0x2000 | uVar579 >> 0x33;
  auVar566 = auVar212 * auVar472 + auVar210 * auVar470 + auVar211 * auVar471 + auVar566;
  uVar610 = auVar566._0_8_;
  auVar527._8_8_ = 0;
  auVar527._0_8_ = auVar566._8_8_ * 0x2000 | uVar610 >> 0x33;
  auVar527 = auVar214 * auVar474 + auVar213 * auVar473 + auVar215 * auVar475 + auVar527;
  uVar608 = auVar527._0_8_;
  uVar598 = (auVar527._8_8_ << 0xd | uVar608 >> 0x33) * 0x13 + (uVar598 & 0x7ffffffffffff);
  uVar590 = (uVar598 >> 0x33) + (uVar590 & 0x7ffffffffffff);
  uVar598 = uVar598 & 0x7ffffffffffff;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uVar598;
  auVar476._8_8_ = 0;
  auVar476._0_8_ = uVar596;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar590;
  auVar477._8_8_ = 0;
  auVar477._0_8_ = uVar596;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar598;
  auVar478._8_8_ = 0;
  auVar478._0_8_ = uVar604;
  uVar579 = uVar579 & 0x7ffffffffffff;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = uVar579;
  auVar479._8_8_ = 0;
  auVar479._0_8_ = uVar596;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar580;
  auVar480._8_8_ = 0;
  auVar480._0_8_ = uVar598;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = uVar590;
  auVar481._8_8_ = 0;
  auVar481._0_8_ = uVar604;
  uVar610 = uVar610 & 0x7ffffffffffff;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = uVar610;
  auVar482._8_8_ = 0;
  auVar482._0_8_ = uVar596;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = uVar599;
  auVar483._8_8_ = 0;
  auVar483._0_8_ = uVar598;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = uVar579;
  auVar484._8_8_ = 0;
  auVar484._0_8_ = uVar604;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = uVar580;
  auVar485._8_8_ = 0;
  auVar485._0_8_ = uVar590;
  uVar608 = uVar608 & 0x7ffffffffffff;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = uVar608;
  auVar486._8_8_ = 0;
  auVar486._0_8_ = uVar596;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = uVar600;
  auVar487._8_8_ = 0;
  auVar487._0_8_ = uVar598;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = uVar599;
  auVar488._8_8_ = 0;
  auVar488._0_8_ = uVar590;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = uVar610;
  auVar489._8_8_ = 0;
  auVar489._0_8_ = uVar604;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = uVar579;
  auVar490._8_8_ = 0;
  auVar490._0_8_ = uVar580;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = uVar590;
  auVar491._8_8_ = 0;
  auVar491._0_8_ = uVar602;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = uVar608;
  auVar492._8_8_ = 0;
  auVar492._0_8_ = uVar601;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = uVar610;
  auVar493._8_8_ = 0;
  auVar493._0_8_ = uVar593;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = uVar579;
  auVar494._8_8_ = 0;
  auVar494._0_8_ = uVar613;
  auVar6 = auVar231 * auVar491 +
           auVar216 * auVar476 + auVar232 * auVar492 + auVar234 * auVar494 + auVar233 * auVar493;
  uVar590 = auVar6._0_8_;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = uVar579;
  auVar495._8_8_ = 0;
  auVar495._0_8_ = uVar602;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = uVar608;
  auVar496._8_8_ = 0;
  auVar496._0_8_ = uVar593;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = uVar610;
  auVar497._8_8_ = 0;
  auVar497._0_8_ = uVar613;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = uVar610;
  auVar498._8_8_ = 0;
  auVar498._0_8_ = uVar602;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = uVar608;
  auVar499._8_8_ = 0;
  auVar499._0_8_ = uVar613;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = uVar608;
  auVar500._8_8_ = 0;
  auVar500._0_8_ = uVar602;
  auVar567._8_8_ = 0;
  auVar567._0_8_ = auVar6._8_8_ * 0x2000 | uVar590 >> 0x33;
  auVar567 = auVar218 * auVar478 + auVar236 * auVar496 + auVar235 * auVar495 + auVar237 * auVar497 +
             auVar217 * auVar477 + auVar567;
  uVar593 = auVar567._0_8_;
  auVar568._8_8_ = 0;
  auVar568._0_8_ = auVar567._8_8_ * 0x2000 | uVar593 >> 0x33;
  auVar568 = auVar221 * auVar481 +
             auVar239 * auVar499 + auVar238 * auVar498 + auVar219 * auVar479 + auVar220 * auVar480 +
             auVar568;
  uVar613 = auVar568._0_8_;
  auVar569._8_8_ = 0;
  auVar569._0_8_ = auVar568._8_8_ * 0x2000 | uVar613 >> 0x33;
  uVar613 = uVar613 & 0x7ffffffffffff;
  auVar569 = auVar225 * auVar485 +
             auVar240 * auVar500 + auVar224 * auVar484 + auVar222 * auVar482 + auVar223 * auVar483 +
             auVar569;
  uVar596 = auVar569._0_8_;
  auVar570._8_8_ = 0;
  auVar570._0_8_ = auVar569._8_8_ * 0x2000 | uVar596 >> 0x33;
  uVar596 = uVar596 & 0x7ffffffffffff;
  auVar570 = auVar228 * auVar488 +
             auVar226 * auVar486 + auVar229 * auVar489 + auVar230 * auVar490 + auVar227 * auVar487 +
             auVar570;
  uVar601 = auVar570._0_8_;
  uVar579 = (auVar570._8_8_ * 0x2000 | uVar601 >> 0x33) * 0x13 + (uVar590 & 0x7ffffffffffff);
  lVar582 = (uVar579 >> 0x33) + (uVar593 & 0x7ffffffffffff);
  uVar579 = uVar579 & 0x7ffffffffffff;
  uVar590 = (uVar579 - uVar589) + 0x1fffffffffffb4;
  uVar593 = (lVar582 - uVar586) + 0x1ffffffffffffc + (uVar590 >> 0x33);
  uVar598 = (uVar613 - uVar587) + 0x1ffffffffffffc + (uVar593 >> 0x33);
  uVar610 = (uVar596 - uVar591) + 0x1ffffffffffffc + (uVar598 >> 0x33);
  uVar601 = uVar601 & 0x7ffffffffffff;
  uVar608 = (uVar601 - uVar588) + 0x1ffffffffffffc + (uVar610 >> 0x33);
  uVar590 = (uVar608 >> 0x33) * 0x13 + (uVar590 & 0x7ffffffffffff);
  uVar602 = (uVar590 >> 0x33) + (uVar593 & 0x7ffffffffffff);
  uVar593 = (uVar602 >> 0x33) + (uVar598 & 0x7ffffffffffff);
  uVar598 = (uVar593 >> 0x33) + (uVar610 & 0x7ffffffffffff);
  uVar608 = (uVar598 >> 0x33) + (uVar608 & 0x7ffffffffffff);
  uVar590 = (uVar608 >> 0x33) * 0x13 + (uVar590 & 0x7ffffffffffff);
  uVar602 = (uVar590 >> 0x33) + (uVar602 & 0x7ffffffffffff);
  uVar593 = (uVar602 >> 0x33) + (uVar593 & 0x7ffffffffffff);
  uVar580 = (uVar593 >> 0x33) + (uVar598 & 0x7ffffffffffff);
  uVar581 = (uVar580 >> 0x33) + (uVar608 & 0x7ffffffffffff);
  uVar610 = (uVar590 & 0x7ffffffffffff) + (uVar581 >> 0x33) * 0x13 + 0x13;
  uVar608 = (uVar610 >> 0x33) + (uVar602 & 0x7ffffffffffff);
  uVar598 = (uVar608 >> 0x33) + (uVar593 & 0x7ffffffffffff);
  uVar593 = (uVar598 >> 0x33) + (uVar580 & 0x7ffffffffffff);
  uVar590 = (uVar593 >> 0x33) + (uVar581 & 0x7ffffffffffff);
  uVar602 = (uVar590 >> 0x33) * 0x13 + (uVar610 & 0x7ffffffffffff) + 0x7ffffffffffed;
  uVar608 = (uVar608 & 0x7ffffffffffff) + 0x7ffffffffffff + (uVar602 >> 0x33);
  uVar598 = (uVar598 & 0x7ffffffffffff) + 0x7ffffffffffff + (uVar608 >> 0x33);
  uVar593 = (uVar593 & 0x7ffffffffffff) + 0x7ffffffffffff + (uVar598 >> 0x33);
  uVar602 = uVar608 << 0x33 | uVar602 & 0x7ffffffffffff;
  r->x[0] = uVar585;
  r->x[1] = uVar611;
  r->x[2] = uVar606;
  r->x[3] = uVar583;
  r->x[4] = uVar578;
  do {
    *(char *)((long)&local_b8 + lVar594) = (char)uVar602;
    lVar594 = lVar594 + 1;
    uVar602 = uVar602 >> 8;
  } while (lVar594 != 8);
  puVar595 = auStack_b0;
  uVar608 = uVar598 << 0x26 | uVar608 >> 0xd & 0x3fffffffff;
  lVar594 = 8;
  do {
    *(char *)puVar595 = (char)uVar608;
    puVar595 = (uint64_t *)((long)puVar595 + 1);
    uVar608 = uVar608 >> 8;
    lVar594 = lVar594 + -1;
  } while (lVar594 != 0);
  uVar598 = uVar593 * 0x2000000 | (ulong)((uint)(uVar598 >> 0x1a) & 0x1ffffff);
  lVar594 = 8;
  do {
    *(char *)puVar595 = (char)uVar598;
    puVar595 = (uint64_t *)((long)puVar595 + 1);
    uVar598 = uVar598 >> 8;
    lVar594 = lVar594 + -1;
  } while (lVar594 != 0);
  uVar590 = (uVar590 + 0x7ffffffffffff + (uVar593 >> 0x33)) * 0x1000 & 0x7ffffffffffff000 |
            (ulong)((uint)(uVar593 >> 0x27) & 0xfff);
  lVar594 = 8;
  do {
    *(char *)puVar595 = (char)uVar590;
    puVar595 = (uint64_t *)((long)puVar595 + 1);
    uVar590 = uVar590 >> 8;
    lVar594 = lVar594 + -1;
  } while (lVar594 != 0);
  lVar594 = 0;
  uVar592 = 0;
  do {
    uVar592 = uVar592 | ""[lVar594] ^ *(byte *)((long)&local_b8 + lVar594);
    lVar594 = lVar594 + 1;
  } while (lVar594 != 0x20);
  if ((uVar592 - 1 >> 8 & 1) == 0) {
    uVar579 = uVar579 + uVar589;
    uVar590 = lVar582 + uVar586 + (uVar579 >> 0x33);
    uVar613 = uVar613 + uVar587 + (uVar590 >> 0x33);
    uVar593 = uVar596 + uVar591 + (uVar613 >> 0x33);
    uVar598 = uVar601 + uVar588 + (uVar593 >> 0x33);
    uVar608 = (uVar598 >> 0x33) * 0x13 + (uVar579 & 0x7ffffffffffff);
    uVar590 = (uVar608 >> 0x33) + (uVar590 & 0x7ffffffffffff);
    uVar579 = (uVar590 >> 0x33) + (uVar613 & 0x7ffffffffffff);
    uVar593 = (uVar579 >> 0x33) + (uVar593 & 0x7ffffffffffff);
    uVar598 = (uVar593 >> 0x33) + (uVar598 & 0x7ffffffffffff);
    uVar608 = (uVar598 >> 0x33) * 0x13 + (uVar608 & 0x7ffffffffffff);
    uVar590 = (uVar608 >> 0x33) + (uVar590 & 0x7ffffffffffff);
    uVar613 = (uVar590 >> 0x33) + (uVar579 & 0x7ffffffffffff);
    uVar579 = (uVar613 >> 0x33) + (uVar593 & 0x7ffffffffffff);
    uVar602 = (uVar579 >> 0x33) + (uVar598 & 0x7ffffffffffff);
    uVar608 = (uVar608 & 0x7ffffffffffff) + (uVar602 >> 0x33) * 0x13 + 0x13;
    uVar590 = (uVar608 >> 0x33) + (uVar590 & 0x7ffffffffffff);
    uVar593 = (uVar590 >> 0x33) + (uVar613 & 0x7ffffffffffff);
    uVar598 = (uVar593 >> 0x33) + (uVar579 & 0x7ffffffffffff);
    uVar579 = (uVar598 >> 0x33) + (uVar602 & 0x7ffffffffffff);
    uVar602 = (uVar608 & 0x7ffffffffffff) + (uVar579 >> 0x33) * 0x13 + 0x7ffffffffffed;
    uVar613 = (uVar602 >> 0x33) + (uVar590 & 0x7ffffffffffff) + 0x7ffffffffffff;
    uVar608 = (uVar613 >> 0x33) + (uVar593 & 0x7ffffffffffff) + 0x7ffffffffffff;
    uVar590 = (uVar608 >> 0x33) + (uVar598 & 0x7ffffffffffff) + 0x7ffffffffffff;
    uVar593 = uVar613 << 0x33 | uVar602 & 0x7ffffffffffff;
    lVar582 = 0;
    do {
      *(char *)((long)&local_b8 + lVar582) = (char)uVar593;
      lVar582 = lVar582 + 1;
      uVar593 = uVar593 >> 8;
    } while (lVar582 != 8);
    puVar595 = auStack_b0;
    uVar593 = uVar608 << 0x26 | uVar613 >> 0xd & 0x3fffffffff;
    lVar582 = 8;
    do {
      *(char *)puVar595 = (char)uVar593;
      puVar595 = (uint64_t *)((long)puVar595 + 1);
      uVar593 = uVar593 >> 8;
      lVar582 = lVar582 + -1;
    } while (lVar582 != 0);
    uVar593 = uVar590 * 0x2000000 | (ulong)((uint)(uVar608 >> 0x1a) & 0x1ffffff);
    lVar582 = 8;
    do {
      *(char *)puVar595 = (char)uVar593;
      puVar595 = (uint64_t *)((long)puVar595 + 1);
      uVar593 = uVar593 >> 8;
      lVar582 = lVar582 + -1;
    } while (lVar582 != 0);
    uVar579 = (uVar579 + 0x7ffffffffffff + (uVar590 >> 0x33)) * 0x1000 & 0x7ffffffffffff000 |
              (ulong)((uint)(uVar590 >> 0x27) & 0xfff);
    lVar582 = 8;
    do {
      *(char *)puVar595 = (char)uVar579;
      puVar595 = (uint64_t *)((long)puVar595 + 1);
      uVar579 = uVar579 >> 8;
      lVar582 = lVar582 + -1;
    } while (lVar582 != 0);
    lVar582 = 0;
    uVar592 = 0;
    do {
      uVar592 = uVar592 | ""[lVar582] ^ *(byte *)((long)&local_b8 + lVar582);
      lVar582 = lVar582 + 1;
    } while (lVar582 != 0x20);
    if ((uVar592 - 1 >> 8 & 1) == 0) {
      return 0;
    }
    auVar241._8_8_ = 0;
    auVar241._0_8_ = uVar585;
    auVar242._8_8_ = 0;
    auVar242._0_8_ = uVar611;
    auVar243._8_8_ = 0;
    auVar243._0_8_ = uVar585;
    auVar244._8_8_ = 0;
    auVar244._0_8_ = uVar606;
    auVar245._8_8_ = 0;
    auVar245._0_8_ = uVar585;
    auVar246._8_8_ = 0;
    auVar246._0_8_ = uVar611;
    auVar247._8_8_ = 0;
    auVar247._0_8_ = uVar583;
    auVar248._8_8_ = 0;
    auVar248._0_8_ = uVar585;
    auVar249._8_8_ = 0;
    auVar249._0_8_ = uVar606;
    auVar250._8_8_ = 0;
    auVar250._0_8_ = uVar611;
    auVar251._8_8_ = 0;
    auVar251._0_8_ = uVar578;
    auVar252._8_8_ = 0;
    auVar252._0_8_ = uVar585;
    auVar253._8_8_ = 0;
    auVar253._0_8_ = uVar611;
    auVar254._8_8_ = 0;
    auVar254._0_8_ = uVar583;
    auVar255._8_8_ = 0;
    auVar255._0_8_ = uVar606;
    auVar256._8_8_ = 0;
    auVar256._0_8_ = uVar611;
    auVar257._8_8_ = 0;
    auVar257._0_8_ = uVar578;
    auVar258._8_8_ = 0;
    auVar258._0_8_ = uVar583;
    auVar259._8_8_ = 0;
    auVar259._0_8_ = uVar606;
    auVar6 = auVar257 * ZEXT816(0xfdb51be9ed3a7) +
             auVar259 * ZEXT816(0x8eea1b5b85afba) + auVar258 * ZEXT816(0x96c405a207eb20) +
             auVar241 * ZEXT816(0x61b274a0ea0b0) + auVar256 * ZEXT816(0x33abbb585eb627);
    uVar579 = auVar6._0_8_;
    auVar260._8_8_ = 0;
    auVar260._0_8_ = uVar606;
    auVar261._8_8_ = 0;
    auVar261._0_8_ = uVar578;
    auVar262._8_8_ = 0;
    auVar262._0_8_ = uVar583;
    auVar263._8_8_ = 0;
    auVar263._0_8_ = uVar583;
    auVar264._8_8_ = 0;
    auVar264._0_8_ = uVar578;
    auVar265._8_8_ = 0;
    auVar265._0_8_ = uVar578;
    auVar571._8_8_ = 0;
    auVar571._0_8_ = auVar6._8_8_ * 0x2000 | uVar579 >> 0x33;
    auVar571 = auVar242 * ZEXT816(0x61b274a0ea0b0) +
               auVar243 * ZEXT816(0xd5a5fc8f189d) +
               auVar262 * ZEXT816(0x8eea1b5b85afba) + auVar260 * ZEXT816(0x33abbb585eb627) +
               auVar261 * ZEXT816(0x96c405a207eb20) + auVar571;
    uVar583 = auVar571._0_8_;
    auVar572._8_8_ = 0;
    auVar572._0_8_ = auVar571._8_8_ * 0x2000 | uVar583 >> 0x33;
    auVar572 = auVar264 * ZEXT816(0x8eea1b5b85afba) +
               auVar244 * ZEXT816(0x61b274a0ea0b0) + auVar263 * ZEXT816(0x33abbb585eb627) +
               auVar245 * ZEXT816(0x7ef5e9cbd0c60) + auVar246 * ZEXT816(0xd5a5fc8f189d) + auVar572;
    uVar578 = auVar572._0_8_;
    auVar573._8_8_ = 0;
    auVar573._0_8_ = auVar572._8_8_ * 0x2000 | uVar578 >> 0x33;
    auVar573 = auVar248 * ZEXT816(0x78595a6804c9e) +
               auVar265 * ZEXT816(0x33abbb585eb627) +
               auVar247 * ZEXT816(0x61b274a0ea0b0) + auVar249 * ZEXT816(0xd5a5fc8f189d) +
               auVar250 * ZEXT816(0x7ef5e9cbd0c60) + auVar573;
    uVar590 = auVar573._0_8_;
    auVar574._8_8_ = 0;
    auVar574._0_8_ = auVar573._8_8_ * 0x2000 | uVar590 >> 0x33;
    auVar574 = auVar253 * ZEXT816(0x78595a6804c9e) +
               auVar252 * ZEXT816(0x2b8324804fc1d) +
               auVar255 * ZEXT816(0x7ef5e9cbd0c60) + auVar254 * ZEXT816(0xd5a5fc8f189d) +
               auVar251 * ZEXT816(0x61b274a0ea0b0) + auVar574;
    uVar585 = auVar574._0_8_;
    uVar579 = (auVar574._8_8_ * 0x2000 | uVar585 >> 0x33) * 0x13 + (uVar579 & 0x7ffffffffffff);
    r->x[0] = uVar579 & 0x7ffffffffffff;
    r->x[1] = (uVar579 >> 0x33) + (uVar583 & 0x7ffffffffffff);
    r->x[2] = uVar578 & 0x7ffffffffffff;
    r->x[3] = uVar590 & 0x7ffffffffffff;
    r->x[4] = uVar585 & 0x7ffffffffffff;
  }
  uVar579 = r->x[0];
  uVar2 = r->x[1];
  uVar3 = r->x[2];
  uVar4 = r->x[3];
  uVar5 = r->x[4];
  uVar583 = (uVar579 >> 0x33) + uVar2;
  uVar585 = (uVar583 >> 0x33) + uVar3;
  uVar590 = (uVar585 >> 0x33) + uVar4;
  uVar593 = (uVar590 >> 0x33) + uVar5;
  uVar578 = (uVar593 >> 0x33) * 0x13 + (uVar579 & 0x7ffffffffffff);
  uVar608 = (uVar578 >> 0x33) + (uVar583 & 0x7ffffffffffff);
  uVar583 = (uVar608 >> 0x33) + (uVar585 & 0x7ffffffffffff);
  uVar613 = (uVar583 >> 0x33) + (uVar590 & 0x7ffffffffffff);
  uVar598 = (uVar613 >> 0x33) + (uVar593 & 0x7ffffffffffff);
  uVar578 = (uVar578 & 0x7ffffffffffff) + (uVar598 >> 0x33) * 0x13 + 0x13;
  uVar585 = (uVar578 >> 0x33) + (uVar608 & 0x7ffffffffffff);
  uVar590 = (uVar585 >> 0x33) + (uVar583 & 0x7ffffffffffff);
  uVar593 = (uVar590 >> 0x33) + (uVar613 & 0x7ffffffffffff);
  uVar583 = (uVar593 >> 0x33) + (uVar598 & 0x7ffffffffffff);
  uVar608 = (uVar578 & 0x7ffffffffffff) + (uVar583 >> 0x33) * 0x13 + 0x7ffffffffffed;
  uVar598 = (uVar608 >> 0x33) + (uVar585 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar578 = (uVar598 >> 0x33) + (uVar590 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar585 = (uVar578 >> 0x33) + (uVar593 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar590 = uVar598 << 0x33 | uVar608 & 0x7ffffffffffff;
  lVar582 = 0;
  do {
    *(char *)((long)&local_b8 + lVar582) = (char)uVar590;
    lVar582 = lVar582 + 1;
    uVar590 = uVar590 >> 8;
  } while (lVar582 != 8);
  puVar595 = auStack_b0;
  uVar590 = uVar578 << 0x26 | uVar598 >> 0xd & 0x3fffffffff;
  lVar582 = 8;
  do {
    *(char *)puVar595 = (char)uVar590;
    puVar595 = (uint64_t *)((long)puVar595 + 1);
    uVar590 = uVar590 >> 8;
    lVar582 = lVar582 + -1;
  } while (lVar582 != 0);
  uVar578 = uVar585 * 0x2000000 | (ulong)((uint)(uVar578 >> 0x1a) & 0x1ffffff);
  lVar582 = 8;
  do {
    *(char *)puVar595 = (char)uVar578;
    puVar595 = (uint64_t *)((long)puVar595 + 1);
    uVar578 = uVar578 >> 8;
    lVar582 = lVar582 + -1;
  } while (lVar582 != 0);
  uVar578 = (uVar583 + 0x7ffffffffffff + (uVar585 >> 0x33)) * 0x1000 & 0x7ffffffffffff000 |
            (ulong)((uint)(uVar585 >> 0x27) & 0xfff);
  lVar582 = 8;
  do {
    *(char *)puVar595 = (char)uVar578;
    puVar595 = (uint64_t *)((long)puVar595 + 1);
    uVar578 = uVar578 >> 8;
    lVar582 = lVar582 + -1;
  } while (lVar582 != 0);
  if (((byte)local_b8 & 1) == bVar1 >> 7) {
    uVar578 = ((0xfffffffffffda - uVar579 >> 0x33) - uVar2) + 0xffffffffffffe;
    r->x[1] = uVar578 & 0x7ffffffffffff;
    uVar578 = ((uVar578 >> 0x33) - uVar3) + 0xffffffffffffe;
    r->x[2] = uVar578 & 0x7ffffffffffff;
    uVar578 = ((uVar578 >> 0x33) - uVar4) + 0xffffffffffffe;
    r->x[3] = uVar578 & 0x7ffffffffffff;
    uVar578 = ((uVar578 >> 0x33) - uVar5) + 0xffffffffffffe;
    r->x[4] = uVar578 & 0x7ffffffffffff;
    r->x[0] = (uVar578 >> 0x33) * 0x13 + (0xfffffffffffda - uVar579 & 0x7ffffffffffff);
  }
  uVar579 = r->y[0];
  uVar578 = r->y[1];
  uVar583 = r->x[0];
  uVar585 = r->x[1];
  auVar266._8_8_ = 0;
  auVar266._0_8_ = uVar583;
  auVar501._8_8_ = 0;
  auVar501._0_8_ = uVar579;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = uVar585;
  auVar502._8_8_ = 0;
  auVar502._0_8_ = uVar579;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = uVar583;
  auVar503._8_8_ = 0;
  auVar503._0_8_ = uVar578;
  uVar590 = r->x[2];
  auVar269._8_8_ = 0;
  auVar269._0_8_ = uVar590;
  auVar504._8_8_ = 0;
  auVar504._0_8_ = uVar579;
  uVar593 = r->y[2];
  auVar270._8_8_ = 0;
  auVar270._0_8_ = uVar583;
  auVar505._8_8_ = 0;
  auVar505._0_8_ = uVar593;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = uVar585;
  auVar506._8_8_ = 0;
  auVar506._0_8_ = uVar578;
  uVar598 = r->x[3];
  auVar272._8_8_ = 0;
  auVar272._0_8_ = uVar598;
  auVar507._8_8_ = 0;
  auVar507._0_8_ = uVar579;
  uVar608 = r->y[3];
  auVar273._8_8_ = 0;
  auVar273._0_8_ = uVar583;
  auVar508._8_8_ = 0;
  auVar508._0_8_ = uVar608;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = uVar590;
  auVar509._8_8_ = 0;
  auVar509._0_8_ = uVar578;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = uVar585;
  auVar510._8_8_ = 0;
  auVar510._0_8_ = uVar593;
  uVar613 = r->x[4];
  auVar276._8_8_ = 0;
  auVar276._0_8_ = uVar613;
  auVar511._8_8_ = 0;
  auVar511._0_8_ = uVar579;
  uVar579 = r->y[4] * 0x13;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = uVar583;
  auVar512._8_8_ = 0;
  auVar512._0_8_ = r->y[4];
  auVar278._8_8_ = 0;
  auVar278._0_8_ = uVar585;
  auVar513._8_8_ = 0;
  auVar513._0_8_ = uVar608;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = uVar598;
  auVar514._8_8_ = 0;
  auVar514._0_8_ = uVar578;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = uVar590;
  auVar515._8_8_ = 0;
  auVar515._0_8_ = uVar593;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = uVar585;
  auVar516._8_8_ = 0;
  auVar516._0_8_ = uVar579;
  uVar608 = uVar608 * 0x13;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = uVar613;
  auVar517._8_8_ = 0;
  auVar517._0_8_ = uVar578 * 0x13;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = uVar598;
  auVar518._8_8_ = 0;
  auVar518._0_8_ = uVar593 * 0x13;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = uVar590;
  auVar519._8_8_ = 0;
  auVar519._0_8_ = uVar608;
  auVar6 = auVar282 * auVar517 +
           auVar284 * auVar519 + auVar281 * auVar516 + auVar266 * auVar501 + auVar283 * auVar518;
  uVar602 = auVar6._0_8_;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = uVar590;
  auVar520._8_8_ = 0;
  auVar520._0_8_ = uVar579;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = uVar613;
  auVar521._8_8_ = 0;
  auVar521._0_8_ = uVar593 * 0x13;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = uVar598;
  auVar522._8_8_ = 0;
  auVar522._0_8_ = uVar608;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = uVar598;
  auVar523._8_8_ = 0;
  auVar523._0_8_ = uVar579;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = uVar613;
  auVar524._8_8_ = 0;
  auVar524._0_8_ = uVar608;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = uVar613;
  auVar525._8_8_ = 0;
  auVar525._0_8_ = uVar579;
  auVar575._8_8_ = 0;
  auVar575._0_8_ = auVar6._8_8_ * 0x2000 | uVar602 >> 0x33;
  auVar575 = auVar285 * auVar520 + auVar267 * auVar502 + auVar268 * auVar503 + auVar287 * auVar522 +
             auVar286 * auVar521 + auVar575;
  uVar578 = auVar575._0_8_;
  auVar576._8_8_ = 0;
  auVar576._0_8_ = auVar575._8_8_ * 0x2000 | uVar578 >> 0x33;
  auVar576 = auVar269 * auVar504 + auVar270 * auVar505 + auVar271 * auVar506 + auVar288 * auVar523 +
             auVar289 * auVar524 + auVar576;
  uVar583 = auVar576._0_8_;
  auVar528._8_8_ = 0;
  auVar528._0_8_ = auVar576._8_8_ * 0x2000 | uVar583 >> 0x33;
  auVar528 = auVar290 * auVar525 +
             auVar272 * auVar507 + auVar274 * auVar509 + auVar273 * auVar508 + auVar275 * auVar510 +
             auVar528;
  uVar585 = auVar528._0_8_;
  auVar577._8_8_ = 0;
  auVar577._0_8_ = auVar528._8_8_ << 0xd | uVar585 >> 0x33;
  auVar577 = auVar279 * auVar514 + auVar277 * auVar512 + auVar278 * auVar513 + auVar280 * auVar515 +
             auVar276 * auVar511 + auVar577;
  uVar590 = auVar577._0_8_;
  uVar579 = (auVar577._8_8_ * 0x2000 | uVar590 >> 0x33) * 0x13 + (uVar602 & 0x7ffffffffffff);
  r->t[0] = uVar579 & 0x7ffffffffffff;
  r->t[1] = (uVar579 >> 0x33) + (uVar578 & 0x7ffffffffffff);
  r->t[2] = uVar583 & 0x7ffffffffffff;
  r->t[3] = uVar585 & 0x7ffffffffffff;
  r->t[4] = uVar590 & 0x7ffffffffffff;
  return 1;
}

Assistant:

static int
ge25519_unpack_negative_vartime(ge25519 *r, const unsigned char p[32]) {
	static const unsigned char zero[32] = {0};
	static const bignum25519 one = {1};
	unsigned char parity = p[31] >> 7;
	unsigned char check[32];
	bignum25519 t, root, num, den, d3;

	curve25519_expand(r->y, p);
	curve25519_copy(r->z, one);
	curve25519_square(num, r->y); /* x = y^2 */
	curve25519_mul(den, num, ge25519_ecd); /* den = dy^2 */
	curve25519_sub_reduce(num, num, r->z); /* x = y^1 - 1 */
	curve25519_add(den, den, r->z); /* den = dy^2 + 1 */

	/* Computation of sqrt(num/den) */
	/* 1.: computation of num^((p-5)/8)*den^((7p-35)/8) = (num*den^7)^((p-5)/8) */
	curve25519_square(t, den);
	curve25519_mul(d3, t, den);
	curve25519_square(r->x, d3);
	curve25519_mul(r->x, r->x, den);
	curve25519_mul(r->x, r->x, num);
	curve25519_pow_two252m3(r->x, r->x);

	/* 2. computation of r->x = num * den^3 * (num*den^7)^((p-5)/8) */
	curve25519_mul(r->x, r->x, d3);
	curve25519_mul(r->x, r->x, num);

	/* 3. Check if either of the roots works: */
	curve25519_square(t, r->x);
	curve25519_mul(t, t, den);
	curve25519_sub_reduce(root, t, num);
	curve25519_contract(check, root);
	if (!ed25519_verify(check, zero, 32)) {
		curve25519_add_reduce(t, t, num);
		curve25519_contract(check, t);
		if (!ed25519_verify(check, zero, 32))
			return 0;
		curve25519_mul(r->x, r->x, ge25519_sqrtneg1);
	}

	curve25519_contract(check, r->x);
	if ((check[0] & 1) == parity) {
		curve25519_copy(t, r->x);
		curve25519_neg(r->x, t);
	}
	curve25519_mul(r->t, r->x, r->y);
	return 1;
}